

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

uint64_t roaring64_iterator_read(roaring64_iterator_t *it,uint64_t *buf,uint64_t count)

{
  ulong uVar1;
  _Bool _Var2;
  ulong uVar3;
  ulong uVar4;
  uint16_t low16;
  uint32_t container_consumed;
  art_iterator_t *local_40;
  ulong local_38;
  
  local_40 = &it->art_it;
  uVar3 = 0;
  local_38 = count;
  while( true ) {
    if (it->has_value != true) {
      return uVar3;
    }
    uVar4 = local_38 - uVar3;
    if (local_38 < uVar3 || uVar4 == 0) break;
    uVar1 = *(it->art_it).value;
    low16 = (uint16_t)it->value;
    if (0xfffffffe < uVar4) {
      uVar4 = 0xffffffff;
    }
    _Var2 = container_iterator_read_into_uint64
                      (it->r->containers[uVar1 >> 8],(uint8_t)uVar1,&it->container_it,it->high48,buf
                       ,(uint32_t)uVar4,&container_consumed,&low16);
    uVar4 = (ulong)container_consumed;
    uVar3 = uVar3 + uVar4;
    if (_Var2) {
      it->has_value = true;
      it->value = (ulong)low16 | it->high48;
      return uVar3;
    }
    _Var2 = art_iterator_next(local_40);
    it->has_value = _Var2;
    if (_Var2) {
      roaring64_iterator_init_at_leaf_first(it);
    }
    buf = buf + uVar4;
  }
  return uVar3;
}

Assistant:

uint64_t roaring64_iterator_read(roaring64_iterator_t *it, uint64_t *buf,
                                 uint64_t count) {
    uint64_t consumed = 0;
    while (it->has_value && consumed < count) {
        uint32_t container_consumed;
        leaf_t leaf = (leaf_t)*it->art_it.value;
        uint16_t low16 = (uint16_t)it->value;
        uint32_t container_count = UINT32_MAX;
        if (count - consumed < (uint64_t)UINT32_MAX) {
            container_count = count - consumed;
        }
        bool has_value = container_iterator_read_into_uint64(
            get_container(it->r, leaf), get_typecode(leaf), &it->container_it,
            it->high48, buf, container_count, &container_consumed, &low16);
        consumed += container_consumed;
        buf += container_consumed;
        if (has_value) {
            it->has_value = true;
            it->value = it->high48 | low16;
            assert(consumed == count);
            return consumed;
        }
        it->has_value = art_iterator_next(&it->art_it);
        if (it->has_value) {
            roaring64_iterator_init_at_leaf_first(it);
        }
    }
    return consumed;
}